

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_head.h
# Opt level: O0

int anon_unknown.dwarf_450db::countZeros(SudokuGitter *gitter,int size)

{
  cell cVar1;
  undefined4 local_20;
  undefined4 local_1c;
  uint col;
  uint row;
  int countZero;
  int size_local;
  SudokuGitter *gitter_local;
  
  col = 0;
  for (local_1c = 0; local_1c < (uint)size; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < (uint)size; local_20 = local_20 + 1) {
      cVar1 = SudokuGitter::getCell(gitter,local_1c,local_20);
      if (cVar1.value == 0) {
        col = col + 1;
      }
    }
  }
  return col;
}

Assistant:

static int countZeros(SudokuGitter gitter, int size) {
        int countZero = 0;
        for (unsigned int row = 0; row < size; row++) {
            for (unsigned int col = 0; col < size; col++) {
                if (gitter.getCell(row, col).value == 0)
                    countZero++;
            }
        }
        return countZero;
    }